

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

Transliterator * icu_63::Transliterator::createBasicInstance(UnicodeString *id,UnicodeString *canon)

{
  UnicodeString *this;
  ushort uVar1;
  TransliteratorAlias *pTVar2;
  UBool UVar3;
  Transliterator *pTVar4;
  int iVar5;
  int32_t iVar6;
  UnicodeString *pUVar7;
  TransliteratorParser *p;
  UParseError *pe_00;
  UErrorCode ec;
  TransliteratorAlias *alias;
  UParseError pe;
  TransliteratorParser parser;
  UErrorCode local_284;
  TransliteratorAlias *local_280;
  UnicodeString *local_278;
  UParseError local_270;
  TransliteratorParser local_228;
  
  local_284 = U_ZERO_ERROR;
  local_280 = (TransliteratorAlias *)0x0;
  pUVar7 = canon;
  umtx_lock_63(&registryMutex);
  if ((registry == (TransliteratorRegistry *)0x0) &&
     (UVar3 = initializeRegistry(&local_284), UVar3 == '\0')) {
    pTVar4 = (Transliterator *)0x0;
  }
  else {
    pUVar7 = id;
    pTVar4 = TransliteratorRegistry::get(registry,id,&local_280,&local_284);
  }
  umtx_unlock_63(&registryMutex);
  if (local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_278 = canon;
    do {
      pUVar7 = local_278;
      if (local_280 == (TransliteratorAlias *)0x0) goto LAB_0027644e;
      UVar3 = TransliteratorAlias::isRuleBased(local_280);
      if (UVar3 == '\0') {
        pe_00 = &local_270;
        pTVar4 = TransliteratorAlias::create(local_280,pe_00,&local_284);
        pUVar7 = local_278;
        pTVar2 = local_280;
        if (local_280 != (TransliteratorAlias *)0x0) {
          TransliteratorAlias::~TransliteratorAlias(local_280);
          UMemory::operator_delete((UMemory *)pTVar2,pe_00);
        }
        local_280 = (TransliteratorAlias *)0x0;
        goto LAB_0027644e;
      }
      TransliteratorParser::TransliteratorParser(&local_228,&local_284);
      p = &local_228;
      TransliteratorAlias::parse(local_280,&local_228,&local_270,&local_284);
      pTVar2 = local_280;
      if (local_280 != (TransliteratorAlias *)0x0) {
        TransliteratorAlias::~TransliteratorAlias(local_280);
        UMemory::operator_delete((UMemory *)pTVar2,p);
      }
      local_280 = (TransliteratorAlias *)0x0;
      umtx_lock_63(&registryMutex);
      if ((registry != (TransliteratorRegistry *)0x0) ||
         (UVar3 = initializeRegistry(&local_284), UVar3 != '\0')) {
        p = (TransliteratorParser *)id;
        pTVar4 = TransliteratorRegistry::reget(registry,id,&local_228,&local_280,&local_284);
      }
      umtx_unlock_63(&registryMutex);
      TransliteratorParser::~TransliteratorParser(&local_228);
    } while (local_284 < U_ILLEGAL_ARGUMENT_ERROR);
    if (pTVar4 != (Transliterator *)0x0) {
      (*(pTVar4->super_UObject)._vptr_UObject[1])(pTVar4);
    }
    pUVar7 = local_278;
    pTVar2 = local_280;
    if (local_280 != (TransliteratorAlias *)0x0) {
      TransliteratorAlias::~TransliteratorAlias(local_280);
      UMemory::operator_delete((UMemory *)pTVar2,p);
    }
    pTVar4 = (Transliterator *)0x0;
LAB_0027644e:
    if ((pUVar7 != (UnicodeString *)0x0) && (pTVar4 != (Transliterator *)0x0)) {
      this = &pTVar4->ID;
      icu_63::UnicodeString::operator=(this,pUVar7);
      local_228._0_2_ = 0;
      icu_63::UnicodeString::doAppend(this,(UChar *)&local_228,0,1);
      uVar1 = (pTVar4->ID).fUnion.fStackFields.fLengthAndFlags;
      if ((short)uVar1 < 0) {
        iVar6 = (pTVar4->ID).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)(short)uVar1 >> 5;
      }
      iVar5 = iVar6 + -1;
      if (iVar5 == 0 && ((int)(short)uVar1 & 1U) != 0) {
        icu_63::UnicodeString::unBogus(this);
      }
      else if (iVar6 != 0) {
        if (iVar6 < 0x401) {
          (pTVar4->ID).fUnion.fStackFields.fLengthAndFlags = (short)iVar5 * 0x20 | uVar1 & 0x1f;
        }
        else {
          (pTVar4->ID).fUnion.fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
          (pTVar4->ID).fUnion.fFields.fLength = iVar5;
        }
      }
    }
  }
  else {
    if (pTVar4 != (Transliterator *)0x0) {
      (*(pTVar4->super_UObject)._vptr_UObject[1])(pTVar4);
    }
    pTVar2 = local_280;
    if (local_280 != (TransliteratorAlias *)0x0) {
      TransliteratorAlias::~TransliteratorAlias(local_280);
      UMemory::operator_delete((UMemory *)pTVar2,pUVar7);
    }
    pTVar4 = (Transliterator *)0x0;
  }
  return pTVar4;
}

Assistant:

Transliterator* Transliterator::createBasicInstance(const UnicodeString& id,
                                                    const UnicodeString* canon) {
    UParseError pe;
    UErrorCode ec = U_ZERO_ERROR;
    TransliteratorAlias* alias = 0;
    Transliterator* t = 0;

    umtx_lock(&registryMutex);
    if (HAVE_REGISTRY(ec)) {
        t = registry->get(id, alias, ec);
    }
    umtx_unlock(&registryMutex);

    if (U_FAILURE(ec)) {
        delete t;
        delete alias;
        return 0;
    }

    // We may have not gotten a transliterator:  Because we can't
    // instantiate a transliterator from inside TransliteratorRegistry::
    // get() (that would deadlock), we sometimes pass back an alias.  This
    // contains the data we need to finish the instantiation outside the
    // registry mutex.  The alias may, in turn, generate another alias, so
    // we handle aliases in a loop.  The max times through the loop is two.
    // [alan]
    while (alias != 0) {
        U_ASSERT(t==0);
        // Rule-based aliases are handled with TransliteratorAlias::
        // parse(), followed by TransliteratorRegistry::reget().
        // Other aliases are handled with TransliteratorAlias::create().
        if (alias->isRuleBased()) {
            // Step 1. parse
            TransliteratorParser parser(ec);
            alias->parse(parser, pe, ec);
            delete alias;
            alias = 0;

            // Step 2. reget
            umtx_lock(&registryMutex);
            if (HAVE_REGISTRY(ec)) {
                t = registry->reget(id, parser, alias, ec);
            }
            umtx_unlock(&registryMutex);

            // Step 3. Loop back around!
        } else {
            t = alias->create(pe, ec);
            delete alias;
            alias = 0;
            break;
        }
        if (U_FAILURE(ec)) {
            delete t;
            delete alias;
            t = NULL;
            break;
        }
    }

    if (t != NULL && canon != NULL) {
        t->setID(*canon);
    }

    return t;
}